

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t roaring_bitmap_size_in_bytes(roaring_bitmap_t *r)

{
  size_t sVar1;
  uint64_t uVar2;
  size_t sVar3;
  
  sVar1 = ra_portable_size_in_bytes(&r->high_low_container);
  uVar2 = roaring_bitmap_get_cardinality(r);
  sVar3 = uVar2 * 4 + 5;
  if (sVar1 < uVar2 * 4 + 4) {
    sVar3 = sVar1 + 1;
  }
  return sVar3;
}

Assistant:

size_t roaring_bitmap_size_in_bytes(const roaring_bitmap_t *r) {
    size_t portablesize = roaring_bitmap_portable_size_in_bytes(r);
    uint64_t sizeasarray =
        roaring_bitmap_get_cardinality(r) * sizeof(uint32_t) + sizeof(uint32_t);
    return portablesize < sizeasarray ? portablesize + 1
                                      : (size_t)sizeasarray + 1;
}